

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbePmaReadBlob(PmaReader *p,int nByte,u8 **ppOut)

{
  long lVar1;
  int iVar2;
  u64 uVar3;
  u64 nBytes;
  u8 *__dest;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  u8 *aNext;
  
  lVar1 = p->iReadOff;
  if (p->aMap == (u8 *)0x0) {
    iVar7 = p->nBuffer;
    lVar5 = lVar1 % (long)iVar7;
    if (lVar5 == 0) {
      lVar4 = p->iEof - lVar1;
      if (lVar4 <= iVar7) {
        iVar7 = (int)lVar4;
      }
      iVar7 = (*p->pFd->pMethods->xRead)(p->pFd,p->aBuffer,iVar7,lVar1);
      if (iVar7 != 0) {
        return iVar7;
      }
      iVar7 = p->nBuffer;
    }
    iVar7 = iVar7 - (int)lVar5;
    iVar6 = nByte - iVar7;
    if (iVar6 == 0 || nByte < iVar7) {
      *ppOut = p->aBuffer + lVar5;
      p->iReadOff = p->iReadOff + (long)nByte;
    }
    else {
      iVar2 = p->nAlloc;
      if (iVar2 < nByte) {
        uVar3 = 0x80;
        if (0x3f < iVar2) {
          uVar3 = (long)iVar2 * 2;
        }
        do {
          nBytes = uVar3;
          uVar3 = nBytes * 2;
        } while ((long)nBytes < (long)nByte);
        __dest = (u8 *)sqlite3Realloc(p->aAlloc,nBytes);
        if (__dest == (u8 *)0x0) {
          return 7;
        }
        p->nAlloc = (int)nBytes;
        p->aAlloc = __dest;
      }
      else {
        __dest = p->aAlloc;
      }
      memcpy(__dest,p->aBuffer + lVar5,(long)iVar7);
      p->iReadOff = p->iReadOff + (long)iVar7;
      for (; 0 < iVar6; iVar6 = iVar6 - iVar7) {
        iVar7 = p->nBuffer;
        if (iVar6 < p->nBuffer) {
          iVar7 = iVar6;
        }
        iVar2 = vdbePmaReadBlob(p,iVar7,&aNext);
        if (iVar2 != 0) {
          return iVar2;
        }
        memcpy(p->aAlloc + (nByte - iVar6),aNext,(long)iVar7);
      }
      *ppOut = p->aAlloc;
    }
  }
  else {
    *ppOut = p->aMap + lVar1;
    p->iReadOff = nByte + lVar1;
  }
  return 0;
}

Assistant:

static int vdbePmaReadBlob(
  PmaReader *p,                   /* PmaReader from which to take the blob */
  int nByte,                      /* Bytes of data to read */
  u8 **ppOut                      /* OUT: Pointer to buffer containing data */
){
  int iBuf;                       /* Offset within buffer to read from */
  int nAvail;                     /* Bytes of data available in buffer */

  if( p->aMap ){
    *ppOut = &p->aMap[p->iReadOff];
    p->iReadOff += nByte;
    return SQLITE_OK;
  }

  assert( p->aBuffer );

  /* If there is no more data to be read from the buffer, read the next
  ** p->nBuffer bytes of data from the file into it. Or, if there are less
  ** than p->nBuffer bytes remaining in the PMA, read all remaining data.  */
  iBuf = p->iReadOff % p->nBuffer;
  if( iBuf==0 ){
    int nRead;                    /* Bytes to read from disk */
    int rc;                       /* sqlite3OsRead() return code */

    /* Determine how many bytes of data to read. */
    if( (p->iEof - p->iReadOff) > (i64)p->nBuffer ){
      nRead = p->nBuffer;
    }else{
      nRead = (int)(p->iEof - p->iReadOff);
    }
    assert( nRead>0 );

    /* Readr data from the file. Return early if an error occurs. */
    rc = sqlite3OsRead(p->pFd, p->aBuffer, nRead, p->iReadOff);
    assert( rc!=SQLITE_IOERR_SHORT_READ );
    if( rc!=SQLITE_OK ) return rc;
  }
  nAvail = p->nBuffer - iBuf;

  if( nByte<=nAvail ){
    /* The requested data is available in the in-memory buffer. In this
    ** case there is no need to make a copy of the data, just return a
    ** pointer into the buffer to the caller.  */
    *ppOut = &p->aBuffer[iBuf];
    p->iReadOff += nByte;
  }else{
    /* The requested data is not all available in the in-memory buffer.
    ** In this case, allocate space at p->aAlloc[] to copy the requested
    ** range into. Then return a copy of pointer p->aAlloc to the caller.  */
    int nRem;                     /* Bytes remaining to copy */

    /* Extend the p->aAlloc[] allocation if required. */
    if( p->nAlloc<nByte ){
      u8 *aNew;
      sqlite3_int64 nNew = MAX(128, 2*(sqlite3_int64)p->nAlloc);
      while( nByte>nNew ) nNew = nNew*2;
      aNew = sqlite3Realloc(p->aAlloc, nNew);
      if( !aNew ) return SQLITE_NOMEM_BKPT;
      p->nAlloc = nNew;
      p->aAlloc = aNew;
    }

    /* Copy as much data as is available in the buffer into the start of
    ** p->aAlloc[].  */
    memcpy(p->aAlloc, &p->aBuffer[iBuf], nAvail);
    p->iReadOff += nAvail;
    nRem = nByte - nAvail;

    /* The following loop copies up to p->nBuffer bytes per iteration into
    ** the p->aAlloc[] buffer.  */
    while( nRem>0 ){
      int rc;                     /* vdbePmaReadBlob() return code */
      int nCopy;                  /* Number of bytes to copy */
      u8 *aNext;                  /* Pointer to buffer to copy data from */

      nCopy = nRem;
      if( nRem>p->nBuffer ) nCopy = p->nBuffer;
      rc = vdbePmaReadBlob(p, nCopy, &aNext);
      if( rc!=SQLITE_OK ) return rc;
      assert( aNext!=p->aAlloc );
      memcpy(&p->aAlloc[nByte - nRem], aNext, nCopy);
      nRem -= nCopy;
    }

    *ppOut = p->aAlloc;
  }

  return SQLITE_OK;
}